

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PidOfIdentiferAt
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr p,EncodedCharPtr last,
          bool fHadEscape,bool fHasMultiChar)

{
  uint32 cch;
  IdentPtr pIVar1;
  undefined7 in_register_00000009;
  undefined3 in_register_00000081;
  
  if (((uint)CONCAT71(in_register_00000009,fHadEscape) |
      CONCAT31(in_register_00000081,fHasMultiChar)) == 1) {
    cch = UnescapeToTempBuf(this,p,last);
    pIVar1 = HashTbl::PidHashNameLen<char16_t>(&this->m_htbl,(this->m_tempChBuf).m_prgch,cch);
    return pIVar1;
  }
  pIVar1 = HashTbl::PidHashNameLen<char>(&this->m_htbl,(char *)p,(char *)last,(int)last - (int)p);
  return pIVar1;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::PidOfIdentiferAt(EncodedCharPtr p, EncodedCharPtr last, bool fHadEscape, bool fHasMultiChar)
{
    // If there is an escape sequence in the JS6 identifier or it is a UTF8
    // source then we have to convert it to the equivalent char so we use a
    // buffer for translation.
    if ((EncodingPolicy::MultiUnitEncoding && fHasMultiChar) || fHadEscape)
    {
        return PidOfIdentiferAt(p, last);
    }
    else if (EncodingPolicy::MultiUnitEncoding)
    {
        Assert(sizeof(EncodedChar) == 1);
        return this->GetHashTbl()->PidHashNameLen(reinterpret_cast<const char *>(p), reinterpret_cast<const char *>(last), (int32)(last - p));
    }
    else
    {
        Assert(sizeof(EncodedChar) == 2);
        return this->GetHashTbl()->PidHashNameLen(reinterpret_cast< const char16 * >(p), (int32)(last - p));
    }
}